

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall
Application::onMessage(Application *this,MarketDataRequest *message,SessionID *param_2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  IncorrectTagValue *this_00;
  undefined1 local_288 [8];
  Symbol symbol;
  int i;
  undefined1 local_208 [8];
  NoRelatedSym noRelatedSymGroup;
  NoRelatedSym noRelatedSym;
  MarketDepth marketDepth;
  undefined1 local_d0 [8];
  SubscriptionRequestType subscriptionRequestType;
  MDReqID mdReqID;
  SessionID *param_2_local;
  MarketDataRequest *message_local;
  Application *this_local;
  
  FIX::MDReqID::MDReqID
            ((MDReqID *)&subscriptionRequestType.super_CharField.super_FieldBase.m_metrics);
  FIX::SubscriptionRequestType::SubscriptionRequestType((SubscriptionRequestType *)local_d0);
  FIX::MarketDepth::MarketDepth
            ((MarketDepth *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
  FIX::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&noRelatedSymGroup.super_Group.m_field);
  FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_208);
  FIX42::MarketDataRequest::get
            (message,(MDReqID *)&subscriptionRequestType.super_CharField.super_FieldBase.m_metrics);
  FIX42::MarketDataRequest::get(message,(SubscriptionRequestType *)local_d0);
  cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_d0);
  if (cVar1 != '0') {
    symbol.super_StringField.super_FieldBase.m_metrics.m_checksum._2_1_ = 1;
    this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
    iVar2 = FIX::FieldBase::getTag((FieldBase *)local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"",
               (allocator<char> *)
               ((long)&symbol.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    FIX::IncorrectTagValue::IncorrectTagValue(this_00,iVar2,(string *)&i);
    symbol.super_StringField.super_FieldBase.m_metrics.m_checksum._2_1_ = 0;
    __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::IncorrectTagValue::~IncorrectTagValue
               );
  }
  FIX42::MarketDataRequest::get
            (message,(MarketDepth *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
  FIX42::MarketDataRequest::get(message,(NoRelatedSym *)&noRelatedSymGroup.super_Group.m_field);
  symbol.super_StringField.super_FieldBase.m_metrics.m_length = 1;
  while( true ) {
    iVar2 = symbol.super_StringField.super_FieldBase.m_metrics.m_length;
    iVar3 = FIX::IntField::operator_cast_to_int((IntField *)&noRelatedSymGroup.super_Group.m_field);
    if (iVar3 < iVar2) break;
    FIX::Symbol::Symbol((Symbol *)local_288);
    FIX::Message::getGroup
              ((Message *)message,symbol.super_StringField.super_FieldBase.m_metrics.m_length,
               (Group *)local_208);
    FIX42::MarketDataRequest::NoRelatedSym::get((NoRelatedSym *)local_208,(Symbol *)local_288);
    FIX::Symbol::~Symbol((Symbol *)local_288);
    symbol.super_StringField.super_FieldBase.m_metrics.m_length =
         symbol.super_StringField.super_FieldBase.m_metrics.m_length + 1;
  }
  FIX42::MarketDataRequest::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)local_208);
  FIX::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)&noRelatedSymGroup.super_Group.m_field);
  FIX::MarketDepth::~MarketDepth
            ((MarketDepth *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
  FIX::SubscriptionRequestType::~SubscriptionRequestType((SubscriptionRequestType *)local_d0);
  FIX::MDReqID::~MDReqID
            ((MDReqID *)&subscriptionRequestType.super_CharField.super_FieldBase.m_metrics);
  return;
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}